

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationDB.cpp
# Opt level: O0

AggregateEntry * __thiscall
aggregate::AggregationDB::find_or_create_entry
          (AggregationDB *this,SnapshotView key,size_t hash,size_t num_aggr_attrs,bool can_alloc)

{
  size_type sVar1;
  reference pvVar2;
  const_iterator pEVar3;
  const_iterator pEVar4;
  reference pvVar5;
  ulong uVar6;
  size_type sVar7;
  back_insert_iterator<std::vector<cali::Entry,_std::allocator<cali::Entry>_>_> __result;
  unsigned_long *puVar8;
  bool local_119;
  unsigned_long local_108;
  size_type local_100;
  size_t entry_idx;
  AggregateEntry e;
  size_t key_idx;
  size_type local_78;
  size_t kernels_idx;
  Entry *local_68;
  reference local_60;
  AggregateEntry *e_1;
  size_t idx;
  size_t count;
  size_t key_len;
  size_t sStack_38;
  bool can_alloc_local;
  size_t num_aggr_attrs_local;
  size_t hash_local;
  AggregationDB *this_local;
  SnapshotView key_local;
  
  key_local.m_data = (Entry *)key.m_len;
  this_local = (AggregationDB *)key.m_data;
  key_len._7_1_ = can_alloc;
  sStack_38 = num_aggr_attrs;
  num_aggr_attrs_local = hash;
  hash_local = (size_t)this;
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_hashmap);
  num_aggr_attrs_local = hash % sVar1;
  count = cali::SnapshotView::size((SnapshotView *)&this_local);
  idx = 0;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->m_hashmap,num_aggr_attrs_local);
  e_1 = (AggregateEntry *)*pvVar2;
  while (e_1 != (AggregateEntry *)0x0) {
    local_60 = std::vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>::
               operator[](&this->m_entries,(size_type)e_1);
    local_119 = false;
    if (count == local_60->key_len) {
      pEVar3 = cali::SnapshotView::begin((SnapshotView *)&this_local);
      pEVar4 = cali::SnapshotView::end((SnapshotView *)&this_local);
      kernels_idx = (size_t)std::vector<cali::Entry,_std::allocator<cali::Entry>_>::begin
                                      (&this->m_keyents);
      local_68 = (Entry *)__gnu_cxx::
                          __normal_iterator<cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
                          ::operator+((__normal_iterator<cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
                                       *)&kernels_idx,local_60->key_idx);
      local_119 = std::
                  equal<cali::Entry_const*,__gnu_cxx::__normal_iterator<cali::Entry*,std::vector<cali::Entry,std::allocator<cali::Entry>>>>
                            (pEVar3,pEVar4,
                             (__normal_iterator<cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
                              )local_68);
    }
    if (local_119 != false) {
      return local_60;
    }
    idx = idx + 1;
    pvVar5 = std::vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>::
             operator[](&this->m_entries,(size_type)e_1);
    e_1 = (AggregateEntry *)pvVar5->next_entry_idx;
  }
  if ((key_len._7_1_ & 1) == 0) {
    sVar1 = std::vector<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>::
            size(&this->m_kernels);
    uVar6 = sVar1 + sStack_38;
    sVar1 = std::vector<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>::
            capacity(&this->m_kernels);
    if (sVar1 <= uVar6) {
      pvVar5 = std::vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>::
               operator[](&this->m_entries,0);
      return pvVar5;
    }
    sVar1 = std::vector<cali::Entry,_std::allocator<cali::Entry>_>::size(&this->m_keyents);
    uVar6 = sVar1 + count;
    sVar1 = std::vector<cali::Entry,_std::allocator<cali::Entry>_>::capacity(&this->m_keyents);
    if (sVar1 <= uVar6) {
      pvVar5 = std::vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>::
               operator[](&this->m_entries,0);
      return pvVar5;
    }
    sVar1 = std::vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>::size
                      (&this->m_entries);
    sVar7 = std::vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>::
            capacity(&this->m_entries);
    if (sVar7 <= sVar1 + 1) {
      pvVar5 = std::vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>::
               operator[](&this->m_entries,0);
      return pvVar5;
    }
  }
  local_78 = std::vector<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>::
             size(&this->m_kernels);
  sVar1 = std::vector<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>::size
                    (&this->m_kernels);
  sVar1 = sVar1 + sStack_38;
  AggregateKernel::AggregateKernel((AggregateKernel *)&key_idx);
  std::vector<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>::resize
            (&this->m_kernels,sVar1,(value_type *)&key_idx);
  sVar1 = std::vector<cali::Entry,_std::allocator<cali::Entry>_>::size(&this->m_keyents);
  pEVar3 = cali::SnapshotView::begin((SnapshotView *)&this_local);
  pEVar4 = cali::SnapshotView::end((SnapshotView *)&this_local);
  __result = std::back_inserter<std::vector<cali::Entry,std::allocator<cali::Entry>>>
                       (&this->m_keyents);
  e.next_entry_idx =
       (size_t)std::
               copy<cali::Entry_const*,std::back_insert_iterator<std::vector<cali::Entry,std::allocator<cali::Entry>>>>
                         (pEVar3,pEVar4,__result);
  entry_idx = 0;
  e.key_idx = count;
  e.key_len = local_78;
  e.kernels_idx = sStack_38;
  e.count = sVar1;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->m_hashmap,num_aggr_attrs_local);
  e.num_kernels = *pvVar2;
  local_100 = std::vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>::
              size(&this->m_entries);
  std::vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>::push_back
            (&this->m_entries,(value_type *)&entry_idx);
  sVar1 = local_100;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->m_hashmap,num_aggr_attrs_local);
  *pvVar2 = sVar1;
  local_108 = idx + 1;
  puVar8 = std::max<unsigned_long>(&this->m_max_hash_len,&local_108);
  this->m_max_hash_len = *puVar8;
  pvVar5 = std::vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>::
           operator[](&this->m_entries,local_100);
  return pvVar5;
}

Assistant:

AggregateEntry* AggregationDB::find_or_create_entry(SnapshotView key, std::size_t hash, std::size_t num_aggr_attrs, bool can_alloc)
{
    hash           = hash % m_hashmap.size();
    size_t key_len = key.size();
    size_t count   = 0;

    for (std::size_t idx = m_hashmap[hash]; idx != 0; idx = m_entries[idx].next_entry_idx) {
        AggregateEntry* e = &m_entries[idx];
        if (key_len == e->key_len && std::equal(key.begin(), key.end(), m_keyents.begin() + e->key_idx))
            return e;
        ++count;
    }

    // --- entry not found, check if we can create a new entry
    //

    if (!can_alloc) {
        if (m_kernels.size() + num_aggr_attrs >= m_kernels.capacity())
            return &m_entries[0];
        if (m_keyents.size() + key_len >= m_keyents.capacity())
            return &m_entries[0];
        if (m_entries.size() + 1 >= m_entries.capacity())
            return &m_entries[0];
    }

    size_t kernels_idx = m_kernels.size();
    m_kernels.resize(m_kernels.size() + num_aggr_attrs, AggregateKernel());

    size_t key_idx = m_keyents.size();
    std::copy(key.begin(), key.end(), std::back_inserter(m_keyents));

    AggregateEntry e;

    e.count          = 0;
    e.key_idx        = key_idx;
    e.key_len        = key_len;
    e.kernels_idx    = kernels_idx;
    e.num_kernels    = num_aggr_attrs;
    e.next_entry_idx = m_hashmap[hash];

    size_t entry_idx = m_entries.size();
    m_entries.push_back(e);
    m_hashmap[hash] = entry_idx;

    m_max_hash_len = std::max(m_max_hash_len, count + 1);

    return &m_entries[entry_idx];
}